

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O2

void __thiscall rtosc::AutomationMgr::setparameternumber(AutomationMgr *this,uint type,int value)

{
  long lStack_8;
  
  if (type == 6) {
    if (((this->NRPN).parhi < 0) || ((this->NRPN).parlo < 0)) {
      return;
    }
    lStack_8 = 0x5c;
  }
  else {
    if (type == 0x26) {
      if ((this->NRPN).parhi < 0) {
        return;
      }
      if ((this->NRPN).parlo < 0) {
        return;
      }
    }
    else {
      if (type == 99) {
        lStack_8 = 0x54;
      }
      else {
        if (type != 0x62) {
          return;
        }
        lStack_8 = 0x58;
      }
      *(int *)((long)&this->slots + lStack_8) = value;
      (this->NRPN).valhi = -1;
      value = -1;
    }
    lStack_8 = 0x60;
  }
  *(int *)((long)&this->slots + lStack_8) = value;
  return;
}

Assistant:

void AutomationMgr::setparameternumber(unsigned int type, int value)
{
    switch(type) {
        case C_nrpnhi:
            NRPN.parhi = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_nrpnlo:
            NRPN.parlo = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_dataentryhi:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.valhi = value;
            break;
        case C_dataentrylo:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.vallo = value;
            break;
    }
}